

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  Reflection *this;
  Reflection *field;
  FieldDescriptor *message_00;
  bool value;
  CppType CVar1;
  int32_t value_00;
  uint32_t value_01;
  LogMessage *other;
  string *psVar2;
  int64_t value_02;
  uint64_t value_03;
  string local_90;
  LogFinisher local_6d [13];
  LogMessage local_60;
  Reflection *local_28;
  Reflection *reflection;
  FieldDescriptor *field_desc_local;
  Message *message_local;
  MapKey *key_local;
  
  reflection = (Reflection *)field_desc;
  field_desc_local = (FieldDescriptor *)message;
  message_local = (Message *)key;
  local_28 = Message::GetReflection(message);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)reflection);
  message_00 = field_desc_local;
  field = reflection;
  this = local_28;
  switch(CVar1) {
  case CPPTYPE_INT32:
    value_00 = MapKey::GetInt32Value((MapKey *)message_local);
    Reflection::SetInt32(this,(Message *)message_00,(FieldDescriptor *)field,value_00);
    break;
  case CPPTYPE_INT64:
    value_02 = MapKey::GetInt64Value((MapKey *)message_local);
    Reflection::SetInt64(this,(Message *)message_00,(FieldDescriptor *)field,value_02);
    break;
  case CPPTYPE_UINT32:
    value_01 = MapKey::GetUInt32Value((MapKey *)message_local);
    Reflection::SetUInt32(this,(Message *)message_00,(FieldDescriptor *)field,value_01);
    break;
  case CPPTYPE_UINT64:
    value_03 = MapKey::GetUInt64Value((MapKey *)message_local);
    Reflection::SetUInt64(this,(Message *)message_00,(FieldDescriptor *)field,value_03);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x91e);
    other = LogMessage::operator<<(&local_60,"Not supported.");
    LogFinisher::operator=(local_6d,other);
    LogMessage::~LogMessage(&local_60);
    break;
  case CPPTYPE_BOOL:
    value = MapKey::GetBoolValue((MapKey *)message_local);
    Reflection::SetBool(this,(Message *)message_00,(FieldDescriptor *)field,value);
    break;
  case CPPTYPE_STRING:
    psVar2 = MapKey::GetStringValue_abi_cxx11_((MapKey *)message_local);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar2);
    Reflection::SetString(this,(Message *)message_00,(FieldDescriptor *)field,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      GOOGLE_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, key.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}